

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O3

void __thiscall tcu::x11::XcbWindow::getDimensions(XcbWindow *this,int *width,int *height)

{
  xcb_connection_t *pxVar1;
  undefined4 uVar2;
  void *ptr;
  
  pxVar1 = this->m_display->m_connection;
  uVar2 = xcb_get_geometry(pxVar1,this->m_window);
  ptr = (void *)xcb_get_geometry_reply(pxVar1,uVar2,0);
  *height = (uint)*(ushort *)((long)ptr + 0x12);
  *width = (uint)*(ushort *)((long)ptr + 0x10);
  deFree(ptr);
  return;
}

Assistant:

void XcbWindow::getDimensions (int* width, int* height) const
{
	xcb_get_geometry_reply_t *geom;
	geom = xcb_get_geometry_reply(m_display.getConnection(), xcb_get_geometry(m_display.getConnection(), m_window), NULL);
	*height = static_cast<int>(geom->height);
	*width = static_cast<int>(geom->width);
	deFree(geom);
}